

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_seek(sexp_conflict ctx,sexp_conflict self,sexp_conflict x,off_t offset,int whence)

{
  sexp psVar1;
  int iVar2;
  sexp_conflict psVar3;
  long lVar4;
  long lVar5;
  
  if (((ulong)x & 3) == 0) {
    if (x->tag - 0x10 < 2) {
      psVar1 = (x->value).type.slots;
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
        lVar4 = lseek((psVar1->value).promise.donep,offset,whence);
        if ((lVar4 < 0) || (offset == 0 && whence == 1)) {
          if (x->tag == 0x11) {
            lVar4 = (long)&((x->value).type.print)->tag + lVar4;
          }
        }
        else {
          (x->value).type.print = (sexp)0x0;
        }
        lVar5 = lVar4 >> 0x3f;
      }
      else {
        psVar1 = (x->value).type.getters;
        if (psVar1 == (sexp)0x0) {
          psVar3 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a seekable port",x);
          return psVar3;
        }
        iVar2 = fseek((FILE *)psVar1,offset,whence);
        lVar4 = (long)iVar2;
        lVar5 = (long)(iVar2 >> 0x1f);
      }
    }
    else {
      if (x->tag != 0x12) goto LAB_00102e66;
      lVar4 = lseek((x->value).promise.donep,offset,whence);
      lVar5 = lVar4 >> 0x3f;
    }
    psVar3 = (sexp_conflict)sexp_make_integer(ctx,lVar4,lVar5);
    return psVar3;
  }
LAB_00102e66:
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0x10,x);
  return psVar3;
}

Assistant:

sexp sexp_seek (sexp ctx, sexp self, sexp x, off_t offset, int whence) {
  off_t res;
  if (! (sexp_portp(x) || sexp_filenop(x)))
    return sexp_type_exception(ctx, self, SEXP_IPORT, x);
  if (sexp_filenop(x))
    return sexp_make_integer(ctx, lseek(sexp_fileno_fd(x), offset, whence));
  if (sexp_filenop(sexp_port_fd(x))) {
    res = lseek(sexp_fileno_fd(sexp_port_fd(x)), offset, whence);
    if (res >= 0 && !(whence == SEEK_CUR && offset == 0))
      sexp_port_offset(x) = 0;
    else if (sexp_oportp(x))
      res += sexp_port_offset(x);
    return sexp_make_integer(ctx, res);
  }
  if (sexp_stream_portp(x))
    return sexp_make_integer(ctx, fseek(sexp_port_stream(x), offset, whence));
  return sexp_xtype_exception(ctx, self, "not a seekable port", x);
}